

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

void Abc_NtkIncrementTravId(Abc_Ntk_t *p)

{
  int iVar1;
  
  if ((p->vTravIds).pArray == (int *)0x0) {
    Vec_IntFill(&p->vTravIds,p->vObjs->nSize + 500,0);
  }
  iVar1 = p->nTravIds;
  p->nTravIds = iVar1 + 1;
  if (iVar1 < 0x3fffffff) {
    return;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

static inline void        Abc_NtkIncrementTravId( Abc_Ntk_t * p )           { if (!p->vTravIds.pArray) Vec_IntFill(&p->vTravIds, Abc_NtkObjNumMax(p)+500, 0); p->nTravIds++; assert(p->nTravIds < (1<<30));  }